

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O3

Wlc_Prs_t * Wlc_PrsStart(char *pFileName)

{
  int iVar1;
  Wlc_Prs_t *pWVar2;
  char *__s;
  size_t sVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Mem_Flex_t *pMVar8;
  
  iVar1 = Extra_FileCheck(pFileName);
  if (iVar1 == 0) {
    pWVar2 = (Wlc_Prs_t *)0x0;
  }
  else {
    pWVar2 = (Wlc_Prs_t *)calloc(1,0x448);
    pWVar2->pFileName = pFileName;
    __s = Extra_FileReadContents(pFileName);
    pWVar2->pBuffer = __s;
    sVar3 = strlen(__s);
    pWVar2->nFileSize = (int)sVar3;
    if ((int)sVar3 < 1) {
      __assert_fail("p->nFileSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadVer.c"
                    ,0x57,"Wlc_Prs_t *Wlc_PrsStart(char *)");
    }
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    iVar1 = 0x10;
    if (0xe < (int)((sVar3 & 0xffffffff) / 0x32) - 1U) {
      iVar1 = (int)((sVar3 & 0xffffffff) / 0x32);
    }
    pVVar4->nSize = 0;
    pVVar4->nCap = iVar1;
    if (iVar1 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc((ulong)(uint)(iVar1 * 4));
    }
    pVVar4->pArray = piVar5;
    pWVar2->vLines = pVVar4;
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nSize = 0;
    pVVar4->nCap = iVar1;
    if (iVar1 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc((ulong)(uint)(iVar1 << 2));
    }
    pVVar4->pArray = piVar5;
    pWVar2->vStarts = pVVar4;
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    pVVar4->nCap = 100;
    pVVar4->nSize = 0;
    piVar5 = (int *)malloc(400);
    pVVar4->pArray = piVar5;
    pWVar2->vFanins = pVVar4;
    pVVar6 = (Vec_Ptr_t *)malloc(0x10);
    pVVar6->nCap = 1000;
    pVVar6->nSize = 0;
    ppvVar7 = (void **)malloc(8000);
    pVVar6->pArray = ppvVar7;
    pWVar2->vTables = pVVar6;
    pMVar8 = Mem_FlexStart();
    pWVar2->pMemTable = pMVar8;
  }
  return pWVar2;
}

Assistant:

Wlc_Prs_t * Wlc_PrsStart( char * pFileName )
{
    Wlc_Prs_t * p;
    if ( !Extra_FileCheck( pFileName ) )
        return NULL;
    p = ABC_CALLOC( Wlc_Prs_t, 1 );
    p->pFileName = pFileName;
    p->pBuffer   = Extra_FileReadContents( pFileName );
    p->nFileSize = strlen(p->pBuffer);  assert( p->nFileSize > 0 );
    p->vLines    = Vec_IntAlloc( p->nFileSize / 50 );
    p->vStarts   = Vec_IntAlloc( p->nFileSize / 50 );
    p->vFanins   = Vec_IntAlloc( 100 );
    p->vTables   = Vec_PtrAlloc( 1000 );
    p->pMemTable = Mem_FlexStart();
    return p;
}